

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::skipgram
          (FastText *this,State *state,real lr,vector<int,_std::allocator<int>_> *line)

{
  const_iterator __position;
  result_type_conflict1 rVar1;
  size_type sVar2;
  element_type *this_00;
  element_type *peVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  pointer in_RDX;
  undefined4 in_XMM0_Da;
  int32_t c;
  int i;
  int factor;
  vector<int,_std::allocator<int>_> ngramsmod;
  vector<int,_std::allocator<int>_> *ngrams;
  int32_t boundary;
  int32_t w;
  uniform_int_distribution<int> uniform;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff48;
  Dictionary *in_stack_ffffffffffffff50;
  int local_84;
  int in_stack_ffffffffffffff8c;
  State *in_stack_ffffffffffffff90;
  iterator in_stack_ffffffffffffff98;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int iVar5;
  element_type *in_stack_ffffffffffffffb0;
  int local_2c;
  pointer in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1927aa);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffff50,
             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(int)in_stack_ffffffffffffff48);
  for (local_2c = 0;
      sVar2 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)in_RDX), (ulong)(long)local_2c < sVar2
      ; local_2c = local_2c + 1) {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)in_stack_ffffffffffffff50,
                       (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                       in_stack_ffffffffffffff48);
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x192826);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)in_RDX,(long)local_2c);
    Dictionary::getSubwords
              (in_stack_ffffffffffffff50,(int32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_ffffffffffffffa0,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff98._M_current);
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x192870);
    iVar5 = peVar3->factor;
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb0);
    if (sVar2 != 0) {
      for (in_stack_ffffffffffffffa8 = 0; in_stack_ffffffffffffffa8 < iVar5;
          in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + 1) {
        in_stack_ffffffffffffff50 = (Dictionary *)&stack0xffffffffffffffb0;
        in_stack_ffffffffffffff98 =
             std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff48);
        __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
        __normal_iterator<int*>
                  ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   in_stack_ffffffffffffff50,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   in_stack_ffffffffffffff48);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,0);
        __position._M_current._4_4_ = in_XMM0_Da;
        __position._M_current._0_4_ = in_stack_ffffffffffffffe8;
        std::vector<int,_std::allocator<int>_>::insert
                  ((vector<int,_std::allocator<int>_> *)in_RDX,__position,
                   (value_type_conflict *)in_stack_ffffffffffffffd8);
      }
    }
    for (local_84 = -rVar1; local_84 <= rVar1; local_84 = local_84 + 1) {
      if ((local_84 != 0) && (-1 < local_2c + local_84)) {
        in_stack_ffffffffffffff48 = (vector<int,_std::allocator<int>_> *)(long)(local_2c + local_84)
        ;
        pvVar4 = (vector<int,_std::allocator<int>_> *)
                 std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)in_RDX);
        if (in_stack_ffffffffffffff48 < pvVar4) {
          std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x192991);
          Model::update((Model *)in_stack_ffffffffffffffb0,
                        (vector<int,_std::allocator<int>_> *)
                        CONCAT44(iVar5,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0,
                        (int32_t)((ulong)in_stack_ffffffffffffff98._M_current >> 0x20),
                        SUB84(in_stack_ffffffffffffff98._M_current,0),in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff8c);
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  }
  return;
}

Assistant:

void FastText::skipgram(
    Model::State& state,
    real lr,
    const std::vector<int32_t>& line) {
  std::uniform_int_distribution<> uniform(1, args_->ws);
  for (int32_t w = 0; w < line.size(); w++) {
    int32_t boundary = uniform(state.rng);
    const std::vector<int32_t>& ngrams = dict_->getSubwords(line[w]);
    std::vector<int32_t> ngramsmod = ngrams;
    int factor = args_->factor;
    if (ngramsmod.size() > 0) {
        for (int i=0; i<factor; i++) ngramsmod.insert(ngramsmod.end(),ngramsmod[0]); //mod avg-pool to weighted-avg-pool
    }
    for (int32_t c = -boundary; c <= boundary; c++) {
      if (c != 0 && w + c >= 0 && w + c < line.size()) {
          model_->update(ngramsmod, line, w + c, lr, state, factor);
      }
    }
  }
}